

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImGuiTableSettings *this;
  ImGuiTextBuffer *in_RDX;
  undefined8 *in_RSI;
  ImGuiTextBuffer *in_RDI;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int column_n;
  ImGuiTableColumnSettings *column;
  bool save_sort;
  bool save_order;
  bool save_visible;
  bool save_size;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiTextBuffer *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  char in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  ImGuiTableColumnSettings *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  this = ImChunkStream<ImGuiTableSettings>::begin
                   ((ImChunkStream<ImGuiTableSettings> *)&in_RDI[0x2f3].Buf.Data);
  while (this != (ImGuiTableSettings *)0x0) {
    if (this->ID != 0) {
      bVar1 = (this->SaveFlags & 1U) != 0;
      bVar2 = (this->SaveFlags & 4U) != 0;
      bVar3 = (this->SaveFlags & 2U) != 0;
      bVar4 = (this->SaveFlags & 8U) != 0;
      if (((((bool)bVar1) || ((bool)bVar2)) || ((bool)bVar3)) || ((bool)bVar4)) {
        ImGuiTextBuffer::size(in_RDX);
        ImGuiTextBuffer::reserve
                  ((ImGuiTextBuffer *)
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,
                                     CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)))
                   ,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        ImGuiTextBuffer::appendf
                  (in_RDX,"[%s][0x%08X,%d]\n",*in_RSI,(ulong)this->ID,
                   (ulong)(uint)(int)this->ColumnsCount);
        if ((this->RefScale != 0.0) || (NAN(this->RefScale))) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)(double)this->RefScale,(char *)in_RDX,"RefScale=%g\n");
        }
        in_stack_ffffffffffffffc8 = ImGuiTableSettings::GetColumnSettings(this);
        for (in_stack_ffffffffffffffc4 = 0; (int)in_stack_ffffffffffffffc4 < (int)this->ColumnsCount
            ; in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
          ImGuiTextBuffer::appendf(in_RDX,"Column %-2d",(ulong)in_stack_ffffffffffffffc4);
          if (in_stack_ffffffffffffffc8->UserID != 0) {
            ImGuiTextBuffer::appendf(in_RDX," UserID=%08X",(ulong)in_stack_ffffffffffffffc8->UserID)
            ;
          }
          if (((bVar1 & 1) != 0) && (((byte)in_stack_ffffffffffffffc8->field_0xb >> 3 & 1) != 0)) {
            ImGuiTextBuffer::appendf
                      ((ImGuiTextBuffer *)(double)in_stack_ffffffffffffffc8->WidthOrWeight,
                       (char *)in_RDX," Weight=%.4f");
          }
          if (((bVar1 & 1) != 0) && (((byte)in_stack_ffffffffffffffc8->field_0xb >> 3 & 1) == 0)) {
            ImGuiTextBuffer::appendf
                      (in_RDX," Width=%d",(ulong)(uint)(int)in_stack_ffffffffffffffc8->WidthOrWeight
                      );
          }
          if ((bVar2 & 1) != 0) {
            ImGuiTextBuffer::appendf
                      (in_RDX," Visible=%d",
                       (ulong)((byte)in_stack_ffffffffffffffc8->field_0xb >> 2 & 1));
          }
          if ((bVar3 & 1) != 0) {
            ImGuiTextBuffer::appendf
                      (in_RDX," Order=%d",(ulong)(uint)(int)in_stack_ffffffffffffffc8->DisplayOrder)
            ;
          }
          if (((bVar4 & 1) != 0) && (in_stack_ffffffffffffffc8->SortOrder != -1)) {
            in_stack_ffffffffffffffb0 = (uint)in_stack_ffffffffffffffc8->SortOrder;
            in_stack_ffffffffffffffb6 = 0x5e;
            in_stack_ffffffffffffffb7 = 'v';
            if ((in_stack_ffffffffffffffc8->field_0xb & 3) != 1) {
              in_stack_ffffffffffffffb7 = '^';
            }
            in_stack_ffffffffffffffa8 = in_RDX;
            ImGuiTextBuffer::appendf
                      (in_RDX," Sort=%d%c",(ulong)in_stack_ffffffffffffffb0,
                       (ulong)(uint)(int)in_stack_ffffffffffffffb7);
          }
          ImGuiTextBuffer::append
                    (in_RDI,(char *)this,
                     (char *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar4,
                                                  in_stack_ffffffffffffffd0)))));
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1;
        }
        ImGuiTextBuffer::append
                  (in_RDI,(char *)this,
                   (char *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar4,
                                                  in_stack_ffffffffffffffd0)))));
      }
    }
    this = ImChunkStream<ImGuiTableSettings>::next_chunk
                     ((ImChunkStream<ImGuiTableSettings> *)in_stack_ffffffffffffffc8,
                      (ImGuiTableSettings *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}